

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O3

void __thiscall
TEST_CommandLineTestRunner_NoPluginsAreInstalledAtTheEndOfARunWhenTheArgumentsAreInvalid_Test::
testBody(TEST_CommandLineTestRunner_NoPluginsAreInstalledAtTheEndOfARunWhenTheArgumentsAreInvalid_Test
         *this)

{
  int iVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  TestRegistry *registry;
  char *argv [2];
  CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner;
  char *local_68;
  char *pcStack_60;
  CommandLineTestRunner local_50;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  
  local_68 = "tests.exe";
  pcStack_60 = "-fdskjnfkds";
  registry = &(this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).registry;
  CommandLineTestRunner::CommandLineTestRunner(&local_50,2,&local_68,registry);
  local_50._vptr_CommandLineTestRunner = (_func_int **)&PTR__CommandLineTestRunner_00348440;
  local_30 = 0;
  uStack_28 = 0;
  local_20 = 0;
  CommandLineTestRunner::runAllTestsMain(&local_50);
  pUVar2 = UtestShell::getCurrent();
  iVar1 = TestRegistry::countPlugins(registry);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0xe])
            (pUVar2,0,(long)iVar1,"LONGS_EQUAL(0, registry.countPlugins()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineTestRunnerTest.cpp"
             ,0x8c,pTVar3);
  CommandLineTestRunner::~CommandLineTestRunner(&local_50);
  return;
}

Assistant:

TEST(CommandLineTestRunner, NoPluginsAreInstalledAtTheEndOfARunWhenTheArgumentsAreInvalid)
{
    const char* argv[] = { "tests.exe", "-fdskjnfkds"};

    CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner(2, argv, &registry);
    commandLineTestRunner.runAllTestsMain();

    LONGS_EQUAL(0, registry.countPlugins());

}